

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

char * __thiscall CTcTokenizer::store_source(CTcTokenizer *this,char *txt,size_t len)

{
  char *len_00;
  char *in_RDX;
  CTcTokenizer *in_RSI;
  size_t in_RDI;
  CTcTokenizer *unaff_retaddr;
  char *p;
  size_t in_stack_ffffffffffffffe0;
  
  reserve_source(unaff_retaddr,in_RDI);
  len_00 = store_source_partial(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
  store_source_partial(in_RSI,in_RDX,(size_t)len_00);
  return len_00;
}

Assistant:

const char *CTcTokenizer::store_source(const char *txt, size_t len)
{
    /* reserve space for the text */
    reserve_source(len);

    /* store it */
    const char *p = store_source_partial(txt, len);

    /* add a null terminator */
    static const char nt[1] = { '\0' };
    store_source_partial(nt, 1);

    /* return the pointer to the stored space */
    return p;
}